

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48],kj::PathPtr&,kj::PathPtr&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [48],PathPtr *params_1,PathPtr *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  long lVar4;
  String argValues [3];
  String *__return_storage_ptr__;
  undefined8 uVar5;
  String local_90;
  String local_78;
  char *local_60;
  size_t local_58;
  ArrayDisposer *pAStack_50;
  char *local_48;
  size_t sStack_40;
  ArrayDisposer *pAStack_38;
  
  this->exception = (Exception *)0x0;
  __return_storage_ptr__ = &local_78;
  str<char_const(&)[48]>
            (__return_storage_ptr__,(kj *)params,(char (*) [48])CONCAT44(in_register_00000014,line))
  ;
  PathPtr::toString(&local_90,params_1,false);
  local_60 = local_90.content.ptr;
  local_58 = local_90.content.size_;
  pAStack_50 = local_90.content.disposer;
  PathPtr::toString(&local_90,params_2,false);
  local_48 = local_90.content.ptr;
  sStack_40 = local_90.content.size_;
  pAStack_38 = local_90.content.disposer;
  uVar5 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,__return_storage_ptr__,uVar5);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}